

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

IdHideMap * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectFieldsAux
          (IdHideMap *__return_storage_ptr__,Interpreter *this,HeapObject *obj_)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  key_type pIVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  long lVar8;
  _Base_ptr p_Var9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *extraout_RAX;
  HeapObject *obj__00;
  mapped_type mVar11;
  undefined1 auVar12 [16];
  _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
  _Stack_58;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var10 = (_Rb_tree_node_base *)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (this != (Interpreter *)0x0) {
    p_Var5 = (_Rb_tree_node_base *)
             __dynamic_cast(this,&(anonymous_namespace)::HeapObject::typeinfo,
                            &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
    if (p_Var5 == (_Rb_tree_node_base *)0x0) {
      auVar12 = __dynamic_cast(this,&(anonymous_namespace)::HeapObject::typeinfo,
                               &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
      lVar8 = auVar12._0_8_;
      if (lVar8 == 0) {
        p_Var10 = (_Rb_tree_node_base *)
                  __dynamic_cast(this,&(anonymous_namespace)::HeapObject::typeinfo,
                                 &(anonymous_namespace)::HeapComprehensionObject::typeinfo,0);
        if (p_Var10 != (_Rb_tree_node_base *)0x0) {
          p_Var4 = p_Var10 + 2;
          p_Var5 = p_Var10[3]._M_parent;
          while (p_Var5 != (_Rb_tree_node_base *)&p_Var4->_M_right) {
            pmVar6 = std::
                     map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                     ::operator[](__return_storage_ptr__,(key_type *)(p_Var5 + 1));
            *pmVar6 = INHERIT;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
            p_Var10 = p_Var5;
          }
        }
      }
      else {
        objectFieldsAux((IdHideMap *)&_Stack_58,*(Interpreter **)(lVar8 + 0x18),auVar12._8_8_);
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
        ::clear(&__return_storage_ptr__->_M_t);
        if (_Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var2 = &_Stack_58._M_impl.super__Rb_tree_header;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
               _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
               _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
               _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
               _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right;
          (_Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &p_Var1->_M_header;
          (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
               _Stack_58._M_impl.super__Rb_tree_header._M_node_count;
          _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
          _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
          _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
        }
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
        ::~_Rb_tree(&_Stack_58);
        objectFieldsAux((IdHideMap *)&_Stack_58,*(Interpreter **)(lVar8 + 0x10),obj__00);
        for (p_Var10 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var10 != &_Stack_58._M_impl.super__Rb_tree_header;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
          p_Var5 = p_Var10 + 1;
          p_Var7 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var7 == (_Base_ptr)0x0) {
LAB_0017664e:
            mVar11 = *(mapped_type *)&p_Var10[1]._M_parent;
            pmVar6 = std::
                     map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                     ::operator[](__return_storage_ptr__,(key_type *)p_Var5);
LAB_0017665a:
            *pmVar6 = mVar11;
          }
          else {
            pIVar3 = *(key_type *)p_Var5;
            p_Var9 = &p_Var1->_M_header;
            do {
              if (*(key_type *)(p_Var7 + 1) >= pIVar3) {
                p_Var9 = p_Var7;
              }
              p_Var7 = (&p_Var7->_M_left)[*(key_type *)(p_Var7 + 1) < pIVar3];
            } while (p_Var7 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var9 == p_Var1) ||
               (pIVar3 < (key_type)((_Rb_tree_header *)p_Var9)->_M_node_count)) goto LAB_0017664e;
            if (*(int *)((long)p_Var9 + 0x28) == 1) {
              mVar11 = *(mapped_type *)&p_Var10[1]._M_parent;
              pmVar6 = std::
                       map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                       ::operator[](__return_storage_ptr__,(key_type *)p_Var5);
              goto LAB_0017665a;
            }
          }
        }
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
        ::~_Rb_tree(&_Stack_58);
        p_Var10 = extraout_RAX;
      }
    }
    else {
      p_Var7 = p_Var5[2]._M_right;
      p_Var10 = p_Var5;
      while (p_Var7 != (_Base_ptr)&p_Var5[2]._M_parent) {
        mVar11 = *(mapped_type *)&p_Var7[1]._M_parent;
        pmVar6 = std::
                 map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)(p_Var7 + 1));
        *pmVar6 = mVar11;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        p_Var10 = p_Var7;
      }
    }
  }
  return (IdHideMap *)p_Var10;
}

Assistant:

Value makeString(const UString &v)
    {
        Value r;
        r.t = Value::STRING;
        r.v.h = makeHeap<HeapString>(v);
        return r;
    }